

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

void xfer_download_queue(fxp_xfer *xfer)

{
  req *prVar1;
  req *prVar2;
  char *pcVar3;
  sftp_request *psVar4;
  int iVar5;
  req **pprVar6;
  
  if (xfer->req_totalsize < xfer->req_maxsize) {
    do {
      if (xfer->eof != false) {
        return;
      }
      if (xfer->err != false) {
        return;
      }
      prVar2 = (req *)safemalloc(1,0x30,0);
      prVar2->offset = xfer->offset;
      prVar2->complete = 0;
      prVar1 = xfer->tail;
      pprVar6 = &prVar1->next;
      if (prVar1 == (req *)0x0) {
        pprVar6 = &xfer->head;
      }
      *pprVar6 = prVar2;
      prVar2->prev = prVar1;
      xfer->tail = prVar2;
      prVar2->next = (req *)0x0;
      prVar2->len = 0x8000;
      pcVar3 = (char *)safemalloc(0x8000,1,0);
      prVar2->buffer = pcVar3;
      psVar4 = fxp_read_send(xfer->fh,prVar2->offset,prVar2->len);
      psVar4->registered = true;
      psVar4->userdata = prVar2;
      iVar5 = prVar2->len;
      xfer->offset = xfer->offset + (long)iVar5;
      iVar5 = xfer->req_totalsize + iVar5;
      xfer->req_totalsize = iVar5;
    } while (iVar5 < xfer->req_maxsize);
  }
  return;
}

Assistant:

void xfer_download_queue(struct fxp_xfer *xfer)
{
    while (xfer->req_totalsize < xfer->req_maxsize &&
           !xfer->eof && !xfer->err) {
        /*
         * Queue a new read request.
         */
        struct req *rr;
        struct sftp_request *req;

        rr = snew(struct req);
        rr->offset = xfer->offset;
        rr->complete = 0;
        if (xfer->tail) {
            xfer->tail->next = rr;
            rr->prev = xfer->tail;
        } else {
            xfer->head = rr;
            rr->prev = NULL;
        }
        xfer->tail = rr;
        rr->next = NULL;

        rr->len = 32768;
        rr->buffer = snewn(rr->len, char);
        sftp_register(req = fxp_read_send(xfer->fh, rr->offset, rr->len));
        fxp_set_userdata(req, rr);

        xfer->offset += rr->len;
        xfer->req_totalsize += rr->len;

#ifdef DEBUG_DOWNLOAD
        printf("queueing read request %p at %"PRIu64"\n", rr, rr->offset);
#endif
    }
}